

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_1::push_pop_messages(DebugMessageTestContext *ctx)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Push/Pop Debug Group","");
  NegativeTestShared::NegativeTestContext::beginSection(&ctx->super_NegativeTestContext,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glPushDebugGroup((CallLogWrapper *)ctx,0x824a,1,-1,"Application group 1");
  (*(ctx->m_debugHost->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [6])(ctx->m_debugHost,0x824a,0x8269);
  glu::CallLogWrapper::glPushDebugGroup((CallLogWrapper *)ctx,0x824a,2,-1,"Application group 1-1");
  (*(ctx->m_debugHost->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [6])(ctx->m_debugHost,0x824a,0x8269);
  glu::CallLogWrapper::glPushDebugGroup((CallLogWrapper *)ctx,0x824a,3,-1,"Application group 1-1-1")
  ;
  (*(ctx->m_debugHost->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [6])(ctx->m_debugHost,0x824a,0x8269);
  glu::CallLogWrapper::glPopDebugGroup((CallLogWrapper *)ctx);
  (*(ctx->m_debugHost->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [6])(ctx->m_debugHost,0x824a,0x826a);
  glu::CallLogWrapper::glPopDebugGroup((CallLogWrapper *)ctx);
  (*(ctx->m_debugHost->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [6])(ctx->m_debugHost,0x824a,0x826a);
  glu::CallLogWrapper::glPushDebugGroup((CallLogWrapper *)ctx,0x824a,4,-1,"Application group 1-2");
  (*(ctx->m_debugHost->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [6])(ctx->m_debugHost,0x824a,0x8269);
  glu::CallLogWrapper::glPopDebugGroup((CallLogWrapper *)ctx);
  (*(ctx->m_debugHost->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [6])(ctx->m_debugHost,0x824a,0x826a);
  glu::CallLogWrapper::glPushDebugGroup((CallLogWrapper *)ctx,0x8249,4,-1,"3rd Party group 1-3");
  (*(ctx->m_debugHost->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [6])(ctx->m_debugHost,0x8249,0x8269);
  glu::CallLogWrapper::glPopDebugGroup((CallLogWrapper *)ctx);
  (*(ctx->m_debugHost->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [6])(ctx->m_debugHost,0x8249,0x826a);
  glu::CallLogWrapper::glPopDebugGroup((CallLogWrapper *)ctx);
  (*(ctx->m_debugHost->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [6])(ctx->m_debugHost,0x824a,0x826a);
  glu::CallLogWrapper::glPushDebugGroup((CallLogWrapper *)ctx,0x8249,4,-1,"3rd Party group 2");
  (*(ctx->m_debugHost->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [6])(ctx->m_debugHost,0x8249,0x8269);
  glu::CallLogWrapper::glPopDebugGroup((CallLogWrapper *)ctx);
  (*(ctx->m_debugHost->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [6])(ctx->m_debugHost,0x8249,0x826a);
  NegativeTestShared::NegativeTestContext::endSection(&ctx->super_NegativeTestContext);
  return;
}

Assistant:

void push_pop_messages (DebugMessageTestContext& ctx)
{
	ctx.beginSection("Push/Pop Debug Group");

	ctx.glPushDebugGroup(GL_DEBUG_SOURCE_APPLICATION, 1, -1, "Application group 1");
	ctx.expectMessage(GL_DEBUG_SOURCE_APPLICATION, GL_DEBUG_TYPE_PUSH_GROUP);
	ctx.glPushDebugGroup(GL_DEBUG_SOURCE_APPLICATION, 2, -1, "Application group 1-1");
	ctx.expectMessage(GL_DEBUG_SOURCE_APPLICATION, GL_DEBUG_TYPE_PUSH_GROUP);
	ctx.glPushDebugGroup(GL_DEBUG_SOURCE_APPLICATION, 3, -1, "Application group 1-1-1");
	ctx.expectMessage(GL_DEBUG_SOURCE_APPLICATION, GL_DEBUG_TYPE_PUSH_GROUP);
	ctx.glPopDebugGroup();
	ctx.expectMessage(GL_DEBUG_SOURCE_APPLICATION, GL_DEBUG_TYPE_POP_GROUP);
	ctx.glPopDebugGroup();
	ctx.expectMessage(GL_DEBUG_SOURCE_APPLICATION, GL_DEBUG_TYPE_POP_GROUP);

	ctx.glPushDebugGroup(GL_DEBUG_SOURCE_APPLICATION, 4, -1, "Application group 1-2");
	ctx.expectMessage(GL_DEBUG_SOURCE_APPLICATION, GL_DEBUG_TYPE_PUSH_GROUP);
	ctx.glPopDebugGroup();
	ctx.expectMessage(GL_DEBUG_SOURCE_APPLICATION, GL_DEBUG_TYPE_POP_GROUP);

	ctx.glPushDebugGroup(GL_DEBUG_SOURCE_THIRD_PARTY, 4, -1, "3rd Party group 1-3");
	ctx.expectMessage(GL_DEBUG_SOURCE_THIRD_PARTY, GL_DEBUG_TYPE_PUSH_GROUP);
	ctx.glPopDebugGroup();
	ctx.expectMessage(GL_DEBUG_SOURCE_THIRD_PARTY, GL_DEBUG_TYPE_POP_GROUP);
	ctx.glPopDebugGroup();
	ctx.expectMessage(GL_DEBUG_SOURCE_APPLICATION, GL_DEBUG_TYPE_POP_GROUP);

	ctx.glPushDebugGroup(GL_DEBUG_SOURCE_THIRD_PARTY, 4, -1, "3rd Party group 2");
	ctx.expectMessage(GL_DEBUG_SOURCE_THIRD_PARTY, GL_DEBUG_TYPE_PUSH_GROUP);
	ctx.glPopDebugGroup();
	ctx.expectMessage(GL_DEBUG_SOURCE_THIRD_PARTY, GL_DEBUG_TYPE_POP_GROUP);

	ctx.endSection();
}